

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall
fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args,istream *in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  
  p_Var1 = (args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  p_Var2 = (args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->ntokens_ = 0;
  auVar4 = ZEXT832(0) << 0x20;
  this->word2int_ = (vector<int,_std::allocator<int>_>)auVar4._0_24_;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar4._24_8_;
  *(undefined1 (*) [32])
   &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar4;
  *(undefined1 (*) [32])
   ((long)&(this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = ZEXT832(0) << 0x20;
  this->pruneidx_size_ = -1;
  (this->pruneidx_)._M_h._M_buckets = &(this->pruneidx_)._M_h._M_single_bucket;
  (this->pruneidx_)._M_h._M_bucket_count = 1;
  auVar3 = ZEXT816(0) << 0x20;
  (this->pruneidx_)._M_h._M_before_begin = (__node_base)auVar3._0_8_;
  (this->pruneidx_)._M_h._M_element_count = auVar3._8_8_;
  (this->pruneidx_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->pruneidx_)._M_h._M_rehash_policy._M_next_resize = auVar3;
  load(this,in);
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args, std::istream& in) : args_(args),
  size_(0), nwords_(0), nlabels_(0), ntokens_(0), pruneidx_size_(-1) {
  load(in);
}